

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O1

void __thiscall
Refal2::CUnitList::Duplicate
          (CUnitList *this,CUnitNode *fromNode,CUnitNode *toNode,CUnitNode **fromNodeCopy,
          CUnitNode **toNodeCopy)

{
  TUnitType TVar1;
  CUnitNode *pCVar2;
  CUnitNode *pCVar3;
  CUnitNode *pCVar4;
  
  CNodeList<Refal2::CUnit>::Duplicate
            (&this->super_CNodeList<Refal2::CUnit>,fromNode,toNode,fromNodeCopy,toNodeCopy);
  pCVar3 = *fromNodeCopy;
  if (pCVar3 != (CUnitNode *)0x0) {
    pCVar4 = (CUnitNode *)0x0;
    do {
      TVar1 = (pCVar3->super_CUnit).type;
      if ((TVar1 & (UT_RightBracket|UT_LeftBracket)) != 0) {
        __assert_fail("!node->IsLeftBracket() && !node->IsRightBracket()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                      ,0xd1,
                      "virtual void Refal2::CUnitList::Duplicate(const CUnitNode *, const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                     );
      }
      if ((TVar1 & UT_LeftParen) == 0) {
        if ((TVar1 & UT_RightParen) != 0) {
          if (pCVar4 == (CUnitNode *)0x0) {
            __assert_fail("leftParen != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                          ,0xd7,
                          "virtual void Refal2::CUnitList::Duplicate(const CUnitNode *, const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                         );
          }
          pCVar2 = (pCVar4->super_CUnit).field_1.pairedParen;
          (pCVar3->super_CUnit).field_1.pairedParen = pCVar4;
          (pCVar4->super_CUnit).field_1.pairedParen = pCVar3;
          pCVar4 = pCVar2;
        }
      }
      else {
        (pCVar3->super_CUnit).field_1.pairedParen = pCVar4;
        pCVar4 = pCVar3;
      }
      if (pCVar3 == *toNodeCopy) {
        if (pCVar4 == (CUnitNode *)0x0) {
          return;
        }
        __assert_fail("lastAddedLeftParen == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                      ,0xe0,
                      "virtual void Refal2::CUnitList::Duplicate(const CUnitNode *, const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                     );
      }
      pCVar3 = pCVar3->next;
    } while (pCVar3 != (CNode<Refal2::CUnit> *)0x0);
  }
  __assert_fail("node != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                ,0xd0,
                "virtual void Refal2::CUnitList::Duplicate(const CUnitNode *, const CUnitNode *, CUnitNode *&, CUnitNode *&)"
               );
}

Assistant:

void CUnitList::Duplicate( const CUnitNode* fromNode,
	const CUnitNode* toNode, CUnitNode*& fromNodeCopy, CUnitNode*& toNodeCopy )
{
	CNodeList::Duplicate( fromNode, toNode, fromNodeCopy, toNodeCopy );
	CUnitNode* lastAddedLeftParen = nullptr;
	for( CUnitNode* node = fromNodeCopy; ; node = node->Next() ) {
		assert( node != nullptr );
		assert( !node->IsLeftBracket() && !node->IsRightBracket() );
		if( node->IsLeftParen() ) {
			node->PairedParen() = lastAddedLeftParen;
			lastAddedLeftParen = node;
		} else if( node->IsRightParen() ) {
			CUnitNode* leftParen = lastAddedLeftParen;
			assert( leftParen != nullptr );
			lastAddedLeftParen = lastAddedLeftParen->PairedParen();
			node->PairedParen() = leftParen;
			leftParen->PairedParen() = node;
		}
		if( node == toNodeCopy ) {
			break;
		}
	}
	assert( lastAddedLeftParen == nullptr );
}